

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.hpp
# Opt level: O2

char * nowide::basic_convert<char,wchar_t>
                 (char *buffer,size_t buffer_size,wchar_t *source_begin,wchar_t *source_end)

{
  wchar_t value;
  char *out;
  ulong uVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  bool bVar5;
  
  if (buffer_size == 0) {
    pcVar3 = (char *)0x0;
  }
  else {
    uVar4 = buffer_size - 1;
    pcVar2 = (char *)0x0;
    out = buffer;
    for (; ((pcVar3 = buffer, source_begin != source_end &&
            (value = *source_begin, pcVar3 = pcVar2, (uint)value < 0x110000)) &&
           ((value & 0x1ff800U) != 0xd800)); source_begin = source_begin + 1) {
      uVar1 = 1;
      if ((0x7f < (uint)value) && (uVar1 = 2, 0x7ff < (uint)value)) {
        uVar1 = 4 - (ulong)((uint)value < 0x10000);
      }
      bVar5 = uVar4 < uVar1;
      uVar4 = uVar4 - uVar1;
      if (bVar5) break;
      out = utf::utf_traits<char,1>::encode<char*>(value,out);
    }
    *out = '\0';
  }
  return pcVar3;
}

Assistant:

CharOut *basic_convert(CharOut *buffer,size_t buffer_size,CharIn const *source_begin,CharIn const *source_end)
    {
        CharOut *rv = buffer;
        if(buffer_size == 0)
            return 0;
        buffer_size --;
        while(source_begin!=source_end) {
            using namespace nowide::utf;
            code_point c = utf_traits<CharIn>::template decode<CharIn const *>(source_begin,source_end);
            if(c==illegal || c==incomplete) {
                rv = 0;
                break;
            }
            size_t width = utf_traits<CharOut>::width(c);
            if(buffer_size < width) {
                rv=0;
                break;
            }
            buffer = utf_traits<CharOut>::template encode<CharOut *>(c,buffer);
            buffer_size -= width;
        }
        *buffer++ = 0;
        return rv;
    }